

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O0

binary_hashes_t binary_fuse8_hash_batch(uint64_t hash,binary_fuse8_t *filter)

{
  binary_hashes_t bVar1;
  uint uVar2;
  uint64_t uVar3;
  long in_RSI;
  uint64_t in_RDI;
  uint64_t hi;
  binary_hashes_t ans;
  undefined4 local_28;
  undefined4 local_18;
  
  uVar3 = binary_fuse_mulhi(in_RDI,(ulong)*(uint *)(in_RSI + 0x18));
  local_28 = (int)uVar3;
  uVar2 = local_28 + *(int *)(in_RSI + 0xc);
  local_18 = (uint)in_RDI;
  bVar1.h1 = uVar2 ^ (uint)(in_RDI >> 0x12) & *(uint *)(in_RSI + 0x10);
  bVar1.h0 = local_28;
  bVar1.h2 = uVar2 + *(int *)(in_RSI + 0xc) ^ local_18 & *(uint *)(in_RSI + 0x10);
  return bVar1;
}

Assistant:

static inline binary_hashes_t binary_fuse8_hash_batch(uint64_t hash,
                                        const binary_fuse8_t *filter) {
  uint64_t hi = binary_fuse_mulhi(hash, filter->SegmentCountLength);
  binary_hashes_t ans;
  ans.h0 = (uint32_t)hi;
  ans.h1 = ans.h0 + filter->SegmentLength;
  ans.h2 = ans.h1 + filter->SegmentLength;
  ans.h1 ^= (uint32_t)(hash >> 18U) & filter->SegmentLengthMask;
  ans.h2 ^= (uint32_t)(hash)&filter->SegmentLengthMask;
  return ans;
}